

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O0

void __thiscall
Catch::Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData>
          (ArgBuilder *this,offset_in_ConfigData_to_bool field)

{
  IArgFunction<Catch::ConfigData> *_functionObj;
  offset_in_ConfigData_to_bool in_stack_ffffffffffffffb8;
  BoundDataMember<Catch::ConfigData,_bool> *in_stack_ffffffffffffffc0;
  BoundArgFunction<Catch::ConfigData> *this_00;
  BoundArgFunction<Catch::ConfigData> *in_stack_ffffffffffffffd8;
  BoundArgFunction<Catch::ConfigData> *in_stack_ffffffffffffffe0;
  BoundArgFunction<Catch::ConfigData> local_18 [3];
  
  _functionObj = (IArgFunction<Catch::ConfigData> *)operator_new(0x10);
  Detail::BoundDataMember<Catch::ConfigData,_bool>::BoundDataMember
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  this_00 = local_18;
  Detail::BoundArgFunction<Catch::ConfigData>::BoundArgFunction(this_00,_functionObj);
  Detail::BoundArgFunction<Catch::ConfigData>::operator=
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  Detail::BoundArgFunction<Catch::ConfigData>::~BoundArgFunction(this_00);
  return;
}

Assistant:

void bind( bool C::* field ) {
                m_arg->boundField = new Detail::BoundDataMember<C,bool>( field );
            }